

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O1

void Llb_ManPrepareVarMap(Llb_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  Vec_Int_t *pVVar9;
  int *__s_00;
  Vec_Int_t *pVVar10;
  int *__s_01;
  Vec_Int_t *pVVar11;
  int *__s_02;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x31,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x32,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x33,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x34,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  pVVar4 = p->vVar2Obj;
  iVar14 = pVVar4->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar12 = iVar14;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar12;
  if (iVar12 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar12 << 2);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar14;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar14 << 2);
  }
  p->vNs2Glo = pVVar8;
  iVar14 = pVVar4->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar12 = iVar14;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar12;
  if (iVar12 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar9->pArray = __s_00;
  pVVar9->nSize = iVar14;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0xff,(long)iVar14 << 2);
  }
  p->vCs2Glo = pVVar9;
  pAVar5 = p->pAig;
  iVar14 = pAVar5->nRegs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar12 = iVar14;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar12;
  if (iVar12 == 0) {
    __s_01 = (int *)0x0;
  }
  else {
    __s_01 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar10->pArray = __s_01;
  pVVar10->nSize = iVar14;
  if (__s_01 != (int *)0x0) {
    memset(__s_01,0xff,(long)iVar14 << 2);
  }
  p->vGlo2Cs = pVVar10;
  iVar14 = pAVar5->nRegs;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar12 = iVar14;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar12;
  if (iVar12 == 0) {
    __s_02 = (int *)0x0;
  }
  else {
    __s_02 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar11->pArray = __s_02;
  pVVar11->nSize = iVar14;
  if (__s_02 != (int *)0x0) {
    memset(__s_02,0xff,(long)iVar14 << 2);
  }
  p->vGlo2Ns = pVVar11;
  if (0 < pAVar5->nRegs) {
    pVVar6 = pAVar5->vCos;
    lVar13 = 0;
    do {
      uVar17 = (ulong)(uint)pAVar5->nTruePos + lVar13;
      iVar14 = (int)uVar17;
      if ((iVar14 < 0) || (pVVar6->nSize <= iVar14)) goto LAB_00819e37;
      uVar15 = (ulong)(uint)pAVar5->nTruePis + lVar13;
      iVar14 = (int)uVar15;
      if ((iVar14 < 0) || (pAVar5->vCis->nSize <= iVar14)) goto LAB_00819e37;
      iVar14 = *(int *)((long)pVVar6->pArray[uVar17 & 0xffffffff] + 0x24);
      if ((long)iVar14 < 0) goto LAB_00819e56;
      iVar12 = p->vObj2Var->nSize;
      if (iVar12 <= iVar14) goto LAB_00819e56;
      iVar1 = *(int *)((long)pAVar5->vCis->pArray[uVar15 & 0xffffffff] + 0x24);
      if (((long)iVar1 < 0) || (iVar12 <= iVar1)) goto LAB_00819e56;
      piVar7 = p->vObj2Var->pArray;
      uVar2 = piVar7[iVar14];
      if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
        __assert_fail("iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                      ,0x3d,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
      }
      uVar3 = piVar7[iVar1];
      if (((int)uVar3 < 0) || (pVVar4->nSize <= (int)uVar3)) {
        __assert_fail("iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                      ,0x3e,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
      }
      if (pVVar8->nSize <= (int)uVar2) goto LAB_00819e18;
      __s[uVar2] = (int)lVar13;
      if (((pVVar9->nSize <= (int)uVar3) || (__s_00[uVar3] = (int)lVar13, pVVar10->nSize <= lVar13))
         || (__s_01[lVar13] = uVar3, pVVar11->nSize <= lVar13)) goto LAB_00819e18;
      __s_02[lVar13] = uVar2;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pAVar5->nRegs);
  }
  if (0 < pAVar5->nTruePis) {
    pVVar6 = pAVar5->vCis;
    lVar13 = 0;
    do {
      if (pVVar6->nSize <= lVar13) {
LAB_00819e37:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar14 = *(int *)((long)pVVar6->pArray[lVar13] + 0x24);
      if (((long)iVar14 < 0) || (p->vObj2Var->nSize <= iVar14)) {
LAB_00819e56:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = p->vObj2Var->pArray[iVar14];
      lVar16 = (long)iVar14;
      if (((lVar16 < 0) || (pVVar9->nSize <= iVar14)) ||
         (__s_00[lVar16] = pAVar5->nRegs + (int)lVar13, pVVar8->nSize <= iVar14)) {
LAB_00819e18:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[lVar16] = pAVar5->nRegs + (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pAVar5->nTruePis);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_ManPrepareVarMap( Llb_Man_t * p )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, iVarLi, iVarLo;
    assert( p->vNs2Glo == NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vNs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vCs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
    {
        iVarLi = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLi));
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        assert( iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj) );
        assert( iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj) );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLi, i );
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarLo );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarLi );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObjLo, i )
    {
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
    }
}